

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLProgram.cpp
# Opt level: O3

void __thiscall
Diligent::GLProgram::SetResources
          (GLProgram *this,shared_ptr<const_Diligent::ShaderResourcesGL> *pResources)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ShaderResourcesGL *__tmp;
  string msg;
  string local_38;
  
  if (this->m_LinkStatus != Succeeded) {
    FormatString<char[53]>
              (&local_38,(char (*) [53])"Program must be successfully linked to set resources");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"SetResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0xa4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  peVar1 = (this->m_pResources).
           super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2 = (pResources->
           super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  if (peVar1 == (element_type *)0x0) {
    p_Var3 = (pResources->
             super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    (pResources->super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>).
    _M_ptr = (element_type *)0x0;
    (pResources->super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->m_pResources).
    super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar2;
    this_00 = (this->m_pResources).
              super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->m_pResources).
    super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  else if (peVar1 != peVar2) {
    FormatString<char[97]>
              (&local_38,
               (char (*) [97])
               "Assigning different resources. This should not happen as cached programs are keyed by shader IDs"
              );
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"SetResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0xab);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GLProgram::SetResources(std::shared_ptr<const ShaderResourcesGL> pResources)
{
    DEV_CHECK_ERR(m_LinkStatus == LinkStatus::Succeeded, "Program must be successfully linked to set resources");
    if (!m_pResources)
    {
        m_pResources = std::move(pResources);
    }
    else
    {
        VERIFY(m_pResources == pResources, "Assigning different resources. This should not happen as cached programs are keyed by shader IDs");
    }
}